

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool dlib::string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  char cVar1;
  bool bVar2;
  string_cast_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38 [32];
  
  if (str->_M_string_length == 1) {
    cVar1 = *(str->_M_dataplus)._M_p;
    if (cVar1 == '0') {
      return false;
    }
    if (cVar1 == '1') {
      return true;
    }
  }
  std::__cxx11::string::string(local_38,(string *)str);
  tolower<std::char_traits<char>,std::allocator<char>>(&bStack_58,(dlib *)local_38,str_00);
  bVar2 = std::operator==(&bStack_58,"true");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string(local_38);
  if (bVar2) {
    return true;
  }
  std::__cxx11::string::string(local_38,(string *)str);
  tolower<std::char_traits<char>,std::allocator<char>>(&bStack_58,(dlib *)local_38,str_01);
  bVar2 = std::operator==(&bStack_58,"false");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string(local_38);
  if (bVar2) {
    return false;
  }
  this = (string_cast_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&bStack_58,(string *)str);
  string_cast_error::string_cast_error(this,&bStack_58);
  __cxa_throw(this,&string_cast_error::typeinfo,error::~error);
}

Assistant:

static bool cast (
            const std::basic_string<charT,traits,alloc>& str
        )
        {
            using namespace std;
            if (str.size() == 1 && str[0] == '1')
                return true;
            if (str.size() == 1 && str[0] == '0')
                return false;
            if (tolower(narrow(str)) == "true")
                return true;
            if (tolower(narrow(str)) == "false")
                return false;

            throw string_cast_error(narrow(str));
        }